

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

void __thiscall gl4cts::DirectStateAccess::Queries::FunctionalTest::draw(FunctionalTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_20;
  uint local_1c;
  GLuint i_1;
  GLuint i;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    (**(code **)(lVar3 + 0x20))(*(undefined4 *)(s_targets + (ulong)local_1c * 4));
  }
  (**(code **)(lVar3 + 0x30))(4);
  (**(code **)(lVar3 + 0x538))(5,0,4);
  (**(code **)(lVar3 + 0x638))();
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    (**(code **)(lVar3 + 0x628))(*(undefined4 *)(s_targets + (ulong)local_20 * 4));
  }
  (**(code **)(lVar3 + 0x648))();
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Drawing function have failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x7a5);
  return;
}

Assistant:

void FunctionalTest::draw()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Start queries. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		gl.beginQuery(s_targets[i], m_qo[i]);
	}

	/* Start XFB. */
	gl.beginTransformFeedback(GL_TRIANGLES);

	/* Draw full screen quad. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

	/* Finish XFB. */
	gl.endTransformFeedback();

	/* Finish queries. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		gl.endQuery(s_targets[i]);
	}

	/* Make sure OpenGL finished drawing. */
	gl.finish();

	/* Error checking. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Drawing function have failed.");
}